

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_append(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *this_00;
  size_t sVar2;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  uint *in_RDI;
  size_t cnt;
  vm_val_t *valp;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  vm_obj_id_t in_stack_ffffffffffffffbc;
  CVmObjVector *in_stack_ffffffffffffffc0;
  vm_obj_id_t self_00;
  
  if ((getp_append(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_append(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_append::desc,1);
    __cxa_guard_release(&getp_append(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_RDI,in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    this_00 = CVmStack::get(0);
    sVar2 = get_element_count((CVmObjVector *)0x34cd56);
    self_00 = (vm_obj_id_t)(sVar2 >> 0x20);
    vm_val_t::set_obj(in_RDX,in_ESI);
    CVmStack::push(in_RDX);
    expand_by(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(size_t)in_RDI);
    set_element_undo((CVmObjVector *)this_00,self_00,(size_t)in_stack_ffffffffffffffc0,
                     (vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    CVmStack::discard(2);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_append(VMG_ vm_obj_id_t self, vm_val_t *retval,
                              uint *argc)
{
    vm_val_t *valp;
    size_t cnt;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value to append, but leave it on the stack */
    valp = G_stk->get(0);

    /* get the old size */
    cnt = get_element_count();

    /* the result object is 'self' */
    retval->set_obj(self);

    /* push a self-reference for gc protection */
    G_stk->push(retval);

    /* expand myself by one element to make room for the addition */
    expand_by(vmg_ self, 1);

    /* add the new element, saving undo */
    set_element_undo(vmg_ self, cnt, valp);

    /* discard the argument and gc protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}